

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_writer.cpp
# Opt level: O2

buffer_writer * __thiscall buffer_writer::operator<<(buffer_writer *this,uint8_t data)

{
  uint8_t local_9;
  
  local_9 = data;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this->_buffer,&local_9);
  return this;
}

Assistant:

buffer_writer& buffer_writer::operator<<(std::uint8_t data)
{
    _buffer.push_back(data);

    return *this;
}